

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O3

mraa_aio_context mraa_aio_init(uint aio)

{
  mraa_pin_t meta;
  mraa_boolean_t mVar1;
  mraa_result_t mVar2;
  uint uVar3;
  mraa_pininfo_t *pmVar4;
  mraa_aio_context dev;
  mraa_adv_func_t *pmVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  mraa_pin_t *pmVar10;
  int *piVar11;
  undefined8 *puVar12;
  mraa_board_t *pmVar13;
  byte bVar14;
  undefined8 auStackY_f8 [7];
  undefined1 in_stack_ffffffffffffff40 [40];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 in_stack_ffffffffffffff6c [56];
  undefined4 local_30;
  
  pmVar13 = plat;
  bVar14 = 0;
  if (plat == (mraa_board_t *)0x0) {
    pcVar9 = "aio: Platform not initialised";
LAB_0010f329:
    syslog(3,pcVar9);
    return (mraa_aio_context)0x0;
  }
  mVar1 = mraa_is_sub_platform_id(aio);
  if (mVar1 != 0) {
    syslog(5,"aio: Using sub platform");
    pmVar13 = pmVar13->sub_platform;
    if (pmVar13 == (mraa_board_t *)0x0) {
      pcVar9 = "aio: Sub platform Not Initialised";
      goto LAB_0010f329;
    }
    aio = mraa_get_sub_platform_index(aio);
  }
  if ((pmVar13->aio_non_seq == 0) || ((uint)pmVar13->aio_count <= aio)) {
    uVar3 = pmVar13->gpio_count + aio;
  }
  else {
    uVar3 = pmVar13->aio_dev[aio].pin;
  }
  uVar8 = (ulong)uVar3;
  if (((int)uVar3 < 0) || (pmVar13->phy_pin_count <= (int)uVar3)) {
    pcVar9 = "aio: pin %i beyond platform definition";
  }
  else {
    if ((uint)pmVar13->aio_count <= aio) {
      pcVar9 = "aio: requested channel out of range";
      goto LAB_0010f329;
    }
    pmVar4 = pmVar13->pins;
    if (((uint)pmVar4[uVar8].capabilities & 0x40) == 0) {
      pcVar9 = "aio: pin %i not capable of aio";
      goto LAB_0010f310;
    }
    if (pmVar4[uVar8].aio.mux_total != 0) {
      pmVar10 = &pmVar4[uVar8].aio;
      piVar11 = (int *)&stack0xffffffffffffff70;
      for (lVar6 = 0x19; lVar6 != 0; lVar6 = lVar6 + -1) {
        *piVar11 = pmVar10->pinmap;
        pmVar10 = (mraa_pin_t *)((long)pmVar10 + (ulong)bVar14 * -8 + 4);
        piVar11 = piVar11 + (ulong)bVar14 * -2 + 1;
      }
      piVar11 = (int *)&stack0xffffffffffffff70;
      puVar12 = auStackY_f8;
      for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar12 = *(undefined8 *)piVar11;
        piVar11 = piVar11 + ((ulong)bVar14 * -2 + 1) * 2;
        puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
      }
      meta.mux[2].pin = local_30;
      auVar15 = in_stack_ffffffffffffff40._12_12_;
      auVar16 = in_stack_ffffffffffffff40._24_12_;
      meta.pinmap = in_stack_ffffffffffffff40._0_4_;
      meta.parent_id = in_stack_ffffffffffffff40._4_4_;
      meta.mux_total = in_stack_ffffffffffffff40._8_4_;
      meta.mux[0].pincmd = auVar15._0_4_;
      meta.mux[0].pin = auVar15._4_4_;
      meta.mux[0].value = auVar15._8_4_;
      meta.mux[1].pincmd = auVar16._0_4_;
      meta.mux[1].pin = auVar16._4_4_;
      meta.mux[1].value = auVar16._8_4_;
      meta.mux[2].pincmd = in_stack_ffffffffffffff40._36_4_;
      auVar15 = in_stack_ffffffffffffff6c._4_12_;
      auVar16 = in_stack_ffffffffffffff6c._16_12_;
      auVar17 = in_stack_ffffffffffffff6c._28_12_;
      meta.mux[2].value = in_stack_ffffffffffffff6c._0_4_;
      meta.mux[3].pincmd = auVar15._0_4_;
      meta.mux[3].pin = auVar15._4_4_;
      meta.mux[3].value = auVar15._8_4_;
      meta.mux[4].pincmd = auVar16._0_4_;
      meta.mux[4].pin = auVar16._4_4_;
      meta.mux[4].value = auVar16._8_4_;
      meta.mux[5].pincmd = auVar17._0_4_;
      meta.mux[5].pin = auVar17._4_4_;
      meta.mux[5].value = auVar17._8_4_;
      meta.output_enable = in_stack_ffffffffffffff6c._40_4_;
      meta.complex_cap = (mraa_pin_cap_complex_t)in_stack_ffffffffffffff6c._44_4_;
      meta.gpio_chip = in_stack_ffffffffffffff6c._48_4_;
      meta.gpio_line = in_stack_ffffffffffffff6c._52_4_;
      mVar2 = mraa_setup_mux_mapped(meta);
      if (mVar2 != MRAA_SUCCESS) {
        pcVar9 = "aio: unable to setup multiplexers for pin";
        goto LAB_0010f329;
      }
      pmVar4 = pmVar13->pins;
    }
    pmVar5 = pmVar13->adv_func;
    uVar3 = pmVar4[uVar8].aio.pinmap;
    dev = (mraa_aio_context)calloc(1,0x18);
    if (dev != (mraa_aio_context)0x0) {
      dev->advance_func = pmVar5;
      if ((pmVar5 == (mraa_adv_func_t *)0x0) ||
         (pmVar5->aio_init_internal_replace == (_func_mraa_result_t_mraa_aio_context_int *)0x0)) {
        dev->channel = uVar3;
        mVar2 = aio_get_valid_fp(dev);
      }
      else {
        mVar2 = (*pmVar5->aio_init_internal_replace)(dev,aio);
      }
      if (mVar2 == MRAA_SUCCESS) {
        uVar3 = mraa_adc_raw_bits();
        raw_bits = uVar3;
        dev->value_bit = 10;
        uVar7 = ~(-1 << ((byte)uVar3 & 0x1f));
        if ((int)uVar3 < 10) {
          shifter_value = 10 - uVar3;
          uVar7 = uVar7 << ((byte)shifter_value & 0x1f);
        }
        else {
          shifter_value = uVar3 - 10;
          uVar7 = uVar7 >> ((byte)shifter_value & 0x1f);
        }
        max_analog_value = (float)(int)uVar7;
        pmVar5 = dev->advance_func;
        if (pmVar5 == (mraa_adv_func_t *)0x0) {
          return dev;
        }
        if (pmVar5->aio_init_pre != (_func_mraa_result_t_uint *)0x0) {
          mVar2 = (*pmVar5->aio_init_pre)(aio);
          if (mVar2 != MRAA_SUCCESS) goto LAB_0010f4a8;
          pmVar5 = dev->advance_func;
          if (pmVar5 == (mraa_adv_func_t *)0x0) {
            return dev;
          }
        }
        if (pmVar5->aio_init_post == (_func_mraa_result_t_mraa_aio_context *)0x0) {
          return dev;
        }
        mVar2 = (*pmVar5->aio_init_post)(dev);
        if (mVar2 == MRAA_SUCCESS) {
          return dev;
        }
LAB_0010f4a8:
        free(dev);
        return (mraa_aio_context)0x0;
      }
      free(dev);
    }
    pcVar9 = "aio: Insufficient memory for specified input channel %d";
    uVar8 = (ulong)aio;
  }
LAB_0010f310:
  syslog(3,pcVar9,uVar8);
  return (mraa_aio_context)0x0;
}

Assistant:

mraa_aio_context
mraa_aio_init(unsigned int aio)
{
    mraa_board_t* board = plat;
    int pin;
    if (board == NULL) {
        syslog(LOG_ERR, "aio: Platform not initialised");
        return NULL;
    }
    if (mraa_is_sub_platform_id(aio)) {
        syslog(LOG_NOTICE, "aio: Using sub platform");
        board = board->sub_platform;
        if (board == NULL) {
            syslog(LOG_ERR, "aio: Sub platform Not Initialised");
            return NULL;
        }
        aio = mraa_get_sub_platform_index(aio);
    }

    // Some boards, like the BBB, don't have sequential AIO pins
    // They will have their own specific mapping to map aio -> pin
    if((board->aio_non_seq) && (aio < board->aio_count)){
        pin = board->aio_dev[aio].pin;
    } else {
        // aio are always past the gpio_count in the pin array
        pin = aio + board->gpio_count;
    }

    if (pin < 0 || pin >= board->phy_pin_count) {
        syslog(LOG_ERR, "aio: pin %i beyond platform definition", pin);
        return NULL;
    }
    if (aio >= board->aio_count) {
        syslog(LOG_ERR, "aio: requested channel out of range");
        return NULL;
    }
    if (board->pins[pin].capabilities.aio != 1) {
        syslog(LOG_ERR, "aio: pin %i not capable of aio", pin);
        return NULL;
    }
    if (board->pins[pin].aio.mux_total > 0) {
        if (mraa_setup_mux_mapped(board->pins[pin].aio) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "aio: unable to setup multiplexers for pin");
            return NULL;
        }
    }

    // Create ADC device connected to specified channel
    mraa_aio_context dev = mraa_aio_init_internal(board->adv_func, aio, board->pins[pin].aio.pinmap);
    if (dev == NULL) {
        syslog(LOG_ERR, "aio: Insufficient memory for specified input channel %d", aio);
        return NULL;
    }

    raw_bits = mraa_adc_raw_bits();
    mraa_aio_set_bit(dev, DEFAULT_BITS);

    if (IS_FUNC_DEFINED(dev, aio_init_pre)) {
        mraa_result_t pre_ret = (dev->advance_func->aio_init_pre(aio));
        if (pre_ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    if (IS_FUNC_DEFINED(dev, aio_init_post)) {
        mraa_result_t ret = dev->advance_func->aio_init_post(dev);
        if (ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    return dev;
}